

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O0

void dgrminer::find_addition_edges
               (AdjacencyListCrate *adjacency_list,
               vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
               *antecedent_pattern_edges_ADDED,
               map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
               *from_pattern_id_to_adj_id_map,int num_of_nondummy_nodes,
               vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
               *edge_mapping_sets,
               set<int,_std::less<int>,_std::allocator<int>_> *edges_occupied_by_antecedent,
               bool debug)

{
  size_t *psVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  void *pvVar6;
  size_type sVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  mapped_type *pmVar11;
  ulong uVar12;
  reference pvVar13;
  reference pvVar14;
  reference pvVar15;
  reference pvVar16;
  reference rVar17;
  pair<std::_Rb_tree_const_iterator<dgrminer::int_pair>,_bool> pVar18;
  reference rVar19;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar20;
  reference local_218;
  byte local_201;
  value_type local_200;
  value_type vStack_1fc;
  bool was_the_edge_dummy_1;
  _Base_ptr local_1f8;
  undefined1 local_1f0;
  value_type local_1e4;
  _Self local_1e0;
  _Self local_1d8;
  undefined1 local_1c9;
  iterator iStack_1c8;
  bool is_edge_occcupied;
  _Self local_1c0;
  byte local_1b2;
  byte local_1b1;
  int local_1b0;
  bool was_already_used;
  bool matches;
  int src_index;
  value_type vStack_1a4;
  bool should_try_dummy;
  undefined1 local_19f;
  undefined1 local_19e;
  key_type_conflict local_19d;
  int local_19c;
  bool dst_is_dummy;
  bool src_is_dummy;
  key_type_conflict local_195;
  int dst_id;
  undefined1 auStack_190 [4];
  int src_id;
  _Bit_type local_188;
  byte local_179;
  _Rb_tree_const_iterator<dgrminer::int_pair> _Stack_178;
  bool was_the_edge_dummy;
  undefined1 local_170;
  value_type local_168;
  int_pair edge_mapping_pair;
  ulong local_150;
  size_t i;
  set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>
  edge_mapping_set;
  undefined1 local_110 [8];
  set<int,_std::less<int>,_std::allocator<int>_> which_edge_ids_are_used;
  vector<int,_std::allocator<int>_> which_indices_should_be_used_next;
  vector<bool,_std::allocator<bool>_> is_the_used_edge_dummy;
  vector<int,_std::allocator<int>_> selected_ids_from_adj;
  int current_index;
  int number_of_created_dummy_edges;
  int special_symbol_for_max_index;
  undefined1 local_70 [8];
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adj_more_info;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adj_list;
  bool debug_local;
  set<int,_std::less<int>,_std::allocator<int>_> *edges_occupied_by_antecedent_local;
  vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
  *edge_mapping_sets_local;
  int num_of_nondummy_nodes_local;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  *from_pattern_id_to_adj_id_map_local;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
  *antecedent_pattern_edges_ADDED_local;
  AdjacencyListCrate *adjacency_list_local;
  
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&adj_more_info.
               super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,&adjacency_list->adjacencyList);
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::vector((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
            *)local_70,&adjacency_list->adjacencyEdgeInfo);
  iVar3 = std::numeric_limits<int>::max();
  selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             &which_indices_should_be_used_next.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  psVar1 = &which_edge_ids_are_used._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)psVar1);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_110);
  edge_mapping_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)psVar1,
             (value_type *)
             ((long)&edge_mapping_set._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
  do {
    if (debug) {
      poVar5 = std::operator<<((ostream *)&std::cout,"CURRENT INDEX: ");
      pvVar6 = (void *)std::ostream::operator<<
                                 (poVar5,(int)selected_ids_from_adj.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_end_of_storage);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    }
    sVar7 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::size
                      (antecedent_pattern_edges_ADDED);
    if (sVar7 <= (ulong)(long)(int)selected_ids_from_adj.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage) {
      std::
      set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>::
      set((set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>
           *)&i);
      local_150 = 0;
      while( true ) {
        sVar7 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)
                           &is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>.
                            _M_impl.super__Bvector_impl_data._M_end_of_storage);
        if (sVar7 <= local_150) break;
        rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)
                            &which_indices_should_be_used_next.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,local_150);
        edge_mapping_pair = (int_pair)rVar17._M_p;
        bVar2 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&edge_mapping_pair);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          pvVar8 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                   operator[](antecedent_pattern_edges_ADDED,local_150);
          pvVar9 = std::array<int,_10UL>::operator[](pvVar8,9);
          local_168.first = *pvVar9;
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               &is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>.
                                _M_impl.super__Bvector_impl_data._M_end_of_storage,local_150);
          local_168.second = *pvVar10;
          pVar18 = std::
                   set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>
                   ::insert((set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>
                             *)&i,&local_168);
          _Stack_178 = pVar18.first._M_node;
          local_170 = pVar18.second;
        }
        local_150 = local_150 + 1;
      }
      std::
      vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
      ::push_back(edge_mapping_sets,(value_type *)&i);
      rVar19 = std::vector<bool,_std::allocator<bool>_>::back
                         ((vector<bool,_std::allocator<bool>_> *)
                          &which_indices_should_be_used_next.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      _auStack_190 = rVar19;
      local_179 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)auStack_190);
      std::vector<int,_std::allocator<int>_>::pop_back
                ((vector<int,_std::allocator<int>_> *)
                 &which_edge_ids_are_used._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if ((local_179 & 1) == 0) {
        pvVar10 = std::vector<int,_std::allocator<int>_>::back
                            ((vector<int,_std::allocator<int>_> *)
                             &is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>.
                              _M_impl.super__Bvector_impl_data._M_end_of_storage);
        std::set<int,_std::less<int>,_std::allocator<int>_>::erase
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)local_110,pvVar10);
      }
      std::vector<bool,_std::allocator<bool>_>::pop_back
                ((vector<bool,_std::allocator<bool>_> *)
                 &which_indices_should_be_used_next.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::pop_back
                ((vector<int,_std::allocator<int>_> *)
                 &is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage);
      selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + -1;
      std::
      set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>::
      ~set((set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>
            *)&i);
    }
    pvVar8 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator[]
                       (antecedent_pattern_edges_ADDED,
                        (long)(int)selected_ids_from_adj.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
    pvVar9 = std::array<int,_10UL>::operator[](pvVar8,0);
    local_195 = (key_type_conflict)*pvVar9;
    pmVar11 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
              operator[](from_pattern_id_to_adj_id_map,&local_195);
    dst_id = *pmVar11;
    pvVar8 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator[]
                       (antecedent_pattern_edges_ADDED,
                        (long)(int)selected_ids_from_adj.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
    pvVar9 = std::array<int,_10UL>::operator[](pvVar8,1);
    local_19d = (key_type_conflict)*pvVar9;
    pmVar11 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
              operator[](from_pattern_id_to_adj_id_map,&local_19d);
    local_19c = *pmVar11;
    local_19e = num_of_nondummy_nodes <= dst_id;
    local_19f = num_of_nondummy_nodes <= local_19c;
    if (((bool)local_19e) || ((bool)local_19f)) {
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)
                           &which_edge_ids_are_used._M_t._M_impl.super__Rb_tree_header._M_node_count
                           ,(long)(int)selected_ids_from_adj.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage);
      if (*pvVar10 != iVar3) {
        psVar1 = &which_edge_ids_are_used._M_t._M_impl.super__Rb_tree_header._M_node_count;
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)psVar1,
                             (long)(int)selected_ids_from_adj.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage);
        *pvVar10 = iVar3;
        vStack_1a4 = 0;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)psVar1,&stack0xfffffffffffffe5c);
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)
                   &which_indices_should_be_used_next.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,true);
        src_index = -1;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   &is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage,&src_index);
        selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (int)selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 1;
      }
    }
    else {
      matches = true;
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)
                           &which_edge_ids_are_used._M_t._M_impl.super__Rb_tree_header._M_node_count
                           ,(long)(int)selected_ids_from_adj.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage);
      local_1b0 = *pvVar10;
      while( true ) {
        uVar12 = (ulong)local_1b0;
        pvVar13 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                *)&adj_more_info.
                                   super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)dst_id);
        sVar7 = std::vector<int,_std::allocator<int>_>::size(pvVar13);
        if (sVar7 <= uVar12) break;
        pvVar13 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                *)&adj_more_info.
                                   super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)dst_id);
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](pvVar13,(long)local_1b0);
        if (*pvVar10 == local_19c) {
          if (debug) {
            poVar5 = std::operator<<((ostream *)&std::cout,"FOUND POSSIBLE EDGE ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,dst_id);
            poVar5 = std::operator<<(poVar5,", ");
            pvVar6 = (void *)std::ostream::operator<<(poVar5,local_19c);
            std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
          }
          pvVar14 = std::
                    vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                    ::operator[]((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                  *)local_70,(long)dst_id);
          pvVar15 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
                    operator[](pvVar14,(long)local_1b0);
          pvVar8 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                   operator[](antecedent_pattern_edges_ADDED,
                              (long)(int)selected_ids_from_adj.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_end_of_storage);
          local_1b1 = is_adj_info_equal_to_pattern_edge(pvVar15,pvVar8,true);
          pvVar14 = std::
                    vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                    ::operator[]((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                  *)local_70,(long)dst_id);
          pvVar15 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
                    operator[](pvVar14,(long)local_1b0);
          pvVar16 = std::array<int,_8UL>::operator[](pvVar15,7);
          local_1c0._M_node =
               (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::find
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)local_110,pvVar16);
          iStack_1c8 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                                 ((set<int,_std::less<int>,_std::allocator<int>_> *)local_110);
          local_1b2 = std::operator!=(&local_1c0,&stack0xfffffffffffffe38);
          pvVar14 = std::
                    vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                    ::operator[]((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                  *)local_70,(long)dst_id);
          pvVar15 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
                    operator[](pvVar14,(long)local_1b0);
          pvVar16 = std::array<int,_8UL>::operator[](pvVar15,7);
          local_1d8._M_node =
               (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::find
                         (edges_occupied_by_antecedent,pvVar16);
          local_1e0._M_node =
               (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::end
                         (edges_occupied_by_antecedent);
          local_1c9 = std::operator!=(&local_1d8,&local_1e0);
          if ((((local_1b1 & 1) != 0) && ((local_1b2 & 1) == 0)) && (!(bool)local_1c9)) {
            if (debug) {
              poVar5 = std::operator<<((ostream *)&std::cout,"IT MATCHES");
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            }
            matches = false;
            iVar4 = local_1b0 + 1;
            psVar1 = &which_edge_ids_are_used._M_t._M_impl.super__Rb_tree_header._M_node_count;
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)psVar1,
                                 (long)(int)selected_ids_from_adj.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_end_of_storage);
            *pvVar10 = iVar4;
            local_1e4 = 0;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)psVar1,&local_1e4);
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)
                       &which_indices_should_be_used_next.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,false);
            pvVar14 = std::
                      vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                      ::operator[]((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                    *)local_70,(long)dst_id);
            pvVar15 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
                      operator[](pvVar14,(long)local_1b0);
            pvVar16 = std::array<int,_8UL>::operator[](pvVar15,7);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       &is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage,pvVar16);
            pvVar14 = std::
                      vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                      ::operator[]((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                    *)local_70,(long)dst_id);
            pvVar15 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
                      operator[](pvVar14,(long)local_1b0);
            pvVar16 = std::array<int,_8UL>::operator[](pvVar15,7);
            pVar20 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                               ((set<int,_std::less<int>,_std::allocator<int>_> *)local_110,pvVar16)
            ;
            local_1f8 = (_Base_ptr)pVar20.first._M_node;
            local_1f0 = pVar20.second;
            selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ =
                 (int)selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 1;
            break;
          }
        }
        local_1b0 = local_1b0 + 1;
      }
      if ((matches & 1U) != 0) {
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)
                             &which_edge_ids_are_used._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count,
                             (long)(int)selected_ids_from_adj.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage);
        if (*pvVar10 != iVar3) {
          psVar1 = &which_edge_ids_are_used._M_t._M_impl.super__Rb_tree_header._M_node_count;
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)psVar1,
                               (long)(int)selected_ids_from_adj.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage);
          *pvVar10 = iVar3;
          vStack_1fc = 0;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)psVar1,&stack0xfffffffffffffe04);
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)
                     &which_indices_should_be_used_next.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_end_of_storage,true);
          local_200 = -1;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     &is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage,&local_200);
          selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ =
               (int)selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 1;
        }
      }
    }
    if ((int)selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage != 0) {
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)
                           &which_edge_ids_are_used._M_t._M_impl.super__Rb_tree_header._M_node_count
                           ,(long)(int)selected_ids_from_adj.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage);
      if (*pvVar10 == iVar3) {
        rVar19 = std::vector<bool,_std::allocator<bool>_>::back
                           ((vector<bool,_std::allocator<bool>_> *)
                            &which_indices_should_be_used_next.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
        local_218 = rVar19;
        local_201 = std::_Bit_reference::operator_cast_to_bool(&local_218);
        std::vector<int,_std::allocator<int>_>::pop_back
                  ((vector<int,_std::allocator<int>_> *)
                   &which_edge_ids_are_used._M_t._M_impl.super__Rb_tree_header._M_node_count);
        if ((local_201 & 1) == 0) {
          pvVar10 = std::vector<int,_std::allocator<int>_>::back
                              ((vector<int,_std::allocator<int>_> *)
                               &is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>.
                                _M_impl.super__Bvector_impl_data._M_end_of_storage);
          std::set<int,_std::less<int>,_std::allocator<int>_>::erase
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)local_110,pvVar10);
        }
        std::vector<bool,_std::allocator<bool>_>::pop_back
                  ((vector<bool,_std::allocator<bool>_> *)
                   &which_indices_should_be_used_next.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<int,_std::allocator<int>_>::pop_back
                  ((vector<int,_std::allocator<int>_> *)
                   &is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage);
        selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (int)selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + -1;
      }
    }
    if ((int)selected_ids_from_adj.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage == 0) {
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)
                           &which_edge_ids_are_used._M_t._M_impl.super__Rb_tree_header._M_node_count
                           ,0);
      if (*pvVar10 == iVar3) {
        std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)local_110);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   &which_edge_ids_are_used._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::vector<bool,_std::allocator<bool>_>::~vector
                  ((vector<bool,_std::allocator<bool>_> *)
                   &which_indices_should_be_used_next.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   &is_the_used_edge_dummy.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage);
        std::
        vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
        ::~vector((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                   *)local_70);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)&adj_more_info.
                      super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        return;
      }
    }
  } while( true );
}

Assistant:

void find_addition_edges(AdjacencyListCrate & adjacency_list, std::vector<std::array<int, PAT___SIZE>> & antecedent_pattern_edges_ADDED,
		std::map<char, int> & from_pattern_id_to_adj_id_map, int num_of_nondummy_nodes, std::vector<std::set<int_pair>> & edge_mapping_sets,
		std::set<int> & edges_occupied_by_antecedent, bool debug)
	{
		std::vector<std::vector<int>> adj_list = adjacency_list.adjacencyList;
		std::vector<std::vector<std::array<int, ADJ_INFO___SIZE>>> adj_more_info = adjacency_list.adjacencyEdgeInfo;

		int special_symbol_for_max_index = std::numeric_limits<int>::max();

		int number_of_created_dummy_edges = 0;

		int current_index = 0; // which of the antecedent_pattern_edges_ADDED are we currently processing

		std::vector<int> selected_ids_from_adj; // which IDS of adj nodes correspond to those in antecedent_pattern_isolated_node_id
		std::vector<bool> is_the_used_edge_dummy;
		std::vector<int> which_indices_should_be_used_next;

		std::set<int> which_edge_ids_are_used;

		which_indices_should_be_used_next.push_back(0); // for the first addition edge, we want to start from the first neighbor in the adjacency list

		// DO DFS:
		while (true)
		{

			if (debug) cout << "CURRENT INDEX: " << current_index << endl;
			// if all ADDITION edges were mapped:
			if (antecedent_pattern_edges_ADDED.size() <= current_index)
			{
                // WE FOUND ALL EDGES (pattern --> adjacency) antecedent_pattern_edges_ADDED[i][PAT_ID] --> selected_ids_from_adj[i]

				// save all pairs PATTERN_EDGE_ID->ADJ_EDGE_ID for non-dummy edges
				std::set<int_pair> edge_mapping_set;
				for (size_t i = 0; i < selected_ids_from_adj.size(); i++)
				{
					if (!is_the_used_edge_dummy[i])
					{
						int_pair edge_mapping_pair;
						edge_mapping_pair.first = antecedent_pattern_edges_ADDED[i][PAT_ID];
						edge_mapping_pair.second = selected_ids_from_adj[i];
						edge_mapping_set.insert(edge_mapping_pair);
					}
				}
				// now save this edge_mapping_set (then we check if it is not a subset of another mapping.. and remove all subsets of this mapping)
				edge_mapping_sets.push_back(edge_mapping_set);

				// AND BACKTRACK:

				bool was_the_edge_dummy = is_the_used_edge_dummy.back();

				which_indices_should_be_used_next.pop_back();
				if (was_the_edge_dummy)
				{
					number_of_created_dummy_edges--;
				}
				else
				{
					which_edge_ids_are_used.erase(selected_ids_from_adj.back());
				}

				is_the_used_edge_dummy.pop_back();
				selected_ids_from_adj.pop_back();
				current_index--;
			}

			int src_id = from_pattern_id_to_adj_id_map[antecedent_pattern_edges_ADDED[current_index][PAT_SRC_ID]];
			int dst_id = from_pattern_id_to_adj_id_map[antecedent_pattern_edges_ADDED[current_index][PAT_DST_ID]];
			// all non_dummy nodes have ID < num_of_nondummy_nodes, so we can check which nodes are dummy by:
			bool src_is_dummy = src_id >= num_of_nondummy_nodes;
			bool dst_is_dummy = dst_id >= num_of_nondummy_nodes;

			// if at least one node of the edge is dummy, then the edge itself is dummy
			if (src_is_dummy || dst_is_dummy)
			{
				// and if we didn't just try it as dummy:
				if (which_indices_should_be_used_next[current_index] != special_symbol_for_max_index)
				{
					// map it as dummy:
					which_indices_should_be_used_next[current_index] = special_symbol_for_max_index;
					which_indices_should_be_used_next.push_back(0);

					is_the_used_edge_dummy.push_back(true);

					selected_ids_from_adj.push_back(-1); // push there arbitrary number (the number is not used)

					number_of_created_dummy_edges++;

					current_index++;
				}
			}
			// if no node of the edge is dummy, then the edge itself can be dummy but doesn't have to be
			else
			{
				bool should_try_dummy = true;

				int src_index = which_indices_should_be_used_next[current_index];

				for (; src_index < adj_list[src_id].size(); src_index++)
				{
					if (adj_list[src_id][src_index] == dst_id)
					{
						if (debug) cout << "FOUND POSSIBLE EDGE " << src_id << ", " << dst_id << endl;
						bool matches = is_adj_info_equal_to_pattern_edge(adj_more_info[src_id][src_index], antecedent_pattern_edges_ADDED[current_index], true);
						bool was_already_used = which_edge_ids_are_used.find(adj_more_info[src_id][src_index][ADJ_INFO_ID]) != which_edge_ids_are_used.end();

						bool is_edge_occcupied = edges_occupied_by_antecedent.find(adj_more_info[src_id][src_index][ADJ_INFO_ID]) != edges_occupied_by_antecedent.end();

						if (matches && !was_already_used && !is_edge_occcupied)
						{
							if (debug) cout << "IT MATCHES" << endl;

							should_try_dummy = false;


							which_indices_should_be_used_next[current_index] = src_index + 1;
							which_indices_should_be_used_next.push_back(0);

							is_the_used_edge_dummy.push_back(false);
							selected_ids_from_adj.push_back(adj_more_info[src_id][src_index][ADJ_INFO_ID]);

							which_edge_ids_are_used.insert(adj_more_info[src_id][src_index][ADJ_INFO_ID]);
							current_index++;
							break;
						}
					}
				}


				// if we tried all regular edges and should backtrack, try to map to a dummy edge first:
				if (should_try_dummy && which_indices_should_be_used_next[current_index] != special_symbol_for_max_index)
				{
					//which_indices_should_be_used_next[current_index] = adj_list[from_id].size() + 1;
					which_indices_should_be_used_next[current_index] = special_symbol_for_max_index;
					which_indices_should_be_used_next.push_back(0);

					is_the_used_edge_dummy.push_back(true);

					selected_ids_from_adj.push_back(-1); // push there arbitrary number (the number is not used)

					number_of_created_dummy_edges++;

					current_index++;
				}
			}

			if (current_index != 0 && which_indices_should_be_used_next[current_index] == special_symbol_for_max_index)
			{
				// now we also tried the dummy one, so really backtrack
				bool was_the_edge_dummy = is_the_used_edge_dummy.back();

				which_indices_should_be_used_next.pop_back();
				if (was_the_edge_dummy)
				{
					number_of_created_dummy_edges--;
				}
				else
				{
					which_edge_ids_are_used.erase(selected_ids_from_adj.back());
				}

				is_the_used_edge_dummy.pop_back();
				selected_ids_from_adj.pop_back();
				current_index--;
			}

			if (current_index == 0 && which_indices_should_be_used_next[current_index] == special_symbol_for_max_index)
			{
				// we tried all combinations, just end:
				break;
			}

		}

	}